

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deCommandLine.hpp
# Opt level: O1

void de::cmdline::detail::dispatchSetDefault<de::cmdline::(anonymous_namespace)::Help>
               (TypedFieldMap *dst)

{
  Entry local_20;
  
  local_20.value = operator_new(1);
  *(undefined1 *)local_20.value = 0;
  local_20.destructor = TypedFieldValueTraits<bool>::destroy;
  TypedFieldMap::set(dst,(type_info *)&cmdline::(anonymous_namespace)::Help::typeinfo,&local_20);
  return;
}

Assistant:

void dispatchSetDefault (TypedFieldMap* dst)
{
	typename OptTraits<OptType>::ValueType* value = new typename OptTraits<OptType>::ValueType();
	try
	{
		getTypeDefault<typename OptTraits<OptType>::ValueType>(value);
		dst->set<OptType>(value);
	}
	catch (...)
	{
		delete value;
		throw;
	}
}